

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O3

char * CVmObjFileName::url_to_local(char *str,size_t len,int nullterm)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  char *buf;
  char *result_buf;
  size_t sVar4;
  size_t len_00;
  ulong __n;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  G_err_frame::__tls_init();
  local_108 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_110;
  local_110[0] = _setjmp(&local_f8);
  if (local_110[0] == 0) {
    len_00 = 0x1000;
    if (0x1000 < len + 0x20) {
      len_00 = len + 0x20;
    }
    if (nullterm == 0) {
      buf = lib_copy_str(str,len);
      str = buf;
    }
    else {
      buf = (char *)0x0;
    }
    result_buf = lib_alloc_str(len_00);
    iVar3 = CVmNetFile::is_net_mode();
    if (iVar3 == 0) {
      os_cvt_url_dir(result_buf,len_00,str);
    }
    else {
      sVar4 = strlen(str);
      __n = len_00 - 1;
      if (sVar4 <= len_00 - 1) {
        __n = sVar4;
      }
      memcpy(result_buf,str,__n);
      result_buf[__n] = '\0';
    }
  }
  else {
    result_buf = (char *)0x0;
    buf = result_buf;
  }
  if (local_110[0] == 1) {
    local_110[0] = 2;
    lib_free_str(result_buf);
    err_rethrow();
  }
  if (-1 < (short)local_110[0]) {
    local_110[0] = local_110[0] | 0x8000;
    lib_free_str(buf);
  }
  lVar1 = local_108;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_110[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_100;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  return result_buf;
}

Assistant:

char *CVmObjFileName::url_to_local(
    VMG_ const char *str, size_t len, int nullterm)
{
    char *strz = 0, *buf = 0;
    err_try
    {
        /* 
         *   Estimate the length of the return string we'll need.  Most
         *   systems these days have Unix-like file naming, where the result
         *   path will be the same length as the source path.  There are
         *   older systems with more complex conventions; for example, VMS
         *   puts directories in brackets.  To allow for this kind of
         *   variation, allocate space for the combined string plus some
         *   overhead.  In any case, use the local maximum filename length as
         *   the lower limit.
         */
        size_t buflen = len + 32;
        if (buflen < OSFNMAX)
            buflen = OSFNMAX;
        
        /* make a null-terminated copy of the string if necessary */
        if (!nullterm)
            strz = lib_copy_str(str, len);
        
        /* allocate a conversion buffer */
        buf = lib_alloc_str(buflen);
        
        /* convert the name */
        fn_cvt_url_dir(vmg_ buf, buflen, nullterm ? str : strz);
    }